

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_decoder.h
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerTraversalPredictiveDecoder::MeshEdgebreakerTraversalPredictiveDecoder
          (MeshEdgebreakerTraversalPredictiveDecoder *this)

{
  RAnsBitDecoder *in_RDI;
  MeshEdgebreakerTraversalDecoder *unaff_retaddr;
  
  MeshEdgebreakerTraversalDecoder::MeshEdgebreakerTraversalDecoder(unaff_retaddr);
  in_RDI[9].ans_decoder_.buf = (uint8_t *)0x0;
  in_RDI[9].ans_decoder_.buf_offset = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x169622);
  RAnsBitDecoder::RAnsBitDecoder(in_RDI);
  *(undefined4 *)&in_RDI[0xb].prob_zero_ = 0xffffffff;
  *(undefined4 *)&in_RDI[0xb].field_0x14 = 0xffffffff;
  return;
}

Assistant:

MeshEdgebreakerTraversalPredictiveDecoder()
      : corner_table_(nullptr),
        num_vertices_(0),
        last_symbol_(-1),
        predicted_symbol_(-1) {}